

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opnmidi_midiplay.cpp
# Opt level: O0

void __thiscall OPNMIDIplay::markSostenutoNotes(OPNMIDIplay *this,int32_t midCh)

{
  uint uVar1;
  bool bVar2;
  OPN2 *pOVar3;
  reference pOVar4;
  pl_cell<OPNMIDIplay::OpnChannel::LocationData> *ppVar5;
  LocationData *jd;
  users_iterator j;
  users_iterator jnext;
  uint32_t c;
  uint32_t last;
  uint32_t first;
  Synth *synth;
  int32_t midCh_local;
  OPNMIDIplay *this_local;
  
  pOVar3 = AdlMIDI_UPtr<OPN2,_ADLMIDI_DefaultDelete<OPN2>_>::operator*(&this->m_synth);
  uVar1 = pOVar3->m_numChannels;
  for (jnext.cell_._4_4_ = 0; jnext.cell_._4_4_ < uVar1; jnext.cell_._4_4_ = jnext.cell_._4_4_ + 1)
  {
    pOVar4 = std::vector<OPNMIDIplay::OpnChannel,_std::allocator<OPNMIDIplay::OpnChannel>_>::
             operator[](&this->m_chipChannels,(ulong)jnext.cell_._4_4_);
    bVar2 = pl_list<OPNMIDIplay::OpnChannel::LocationData>::empty(&pOVar4->users);
    if (!bVar2) {
      pOVar4 = std::vector<OPNMIDIplay::OpnChannel,_std::allocator<OPNMIDIplay::OpnChannel>_>::
               operator[](&this->m_chipChannels,(ulong)jnext.cell_._4_4_);
      j.cell_ = (pl_cell<OPNMIDIplay::OpnChannel::LocationData> *)
                pl_list<OPNMIDIplay::OpnChannel::LocationData>::begin(&pOVar4->users);
      while (bVar2 = pl_iterator<pl_cell<OPNMIDIplay::OpnChannel::LocationData>_>::is_end(&j),
            ((bVar2 ^ 0xffU) & 1) != 0) {
        jd = (LocationData *)j.cell_;
        ppVar5 = pl_iterator<pl_cell<OPNMIDIplay::OpnChannel::LocationData>_>::operator->
                           ((pl_iterator<pl_cell<OPNMIDIplay::OpnChannel::LocationData>_> *)&jd);
        pl_iterator<pl_cell<OPNMIDIplay::OpnChannel::LocationData>_>::operator++(&j);
        if (((uint)(ppVar5->value).loc.MidCh == midCh) && ((ppVar5->value).sustained == 0)) {
          (ppVar5->value).sustained = (ppVar5->value).sustained | 2;
        }
      }
    }
  }
  return;
}

Assistant:

void OPNMIDIplay::markSostenutoNotes(int32_t midCh)
{
    Synth &synth = *m_synth;
    uint32_t first = 0, last = synth.m_numChannels;
    for(uint32_t c = first; c < last; ++c)
    {
        if(m_chipChannels[c].users.empty())
            continue; // Nothing to do

        for(OpnChannel::users_iterator jnext = m_chipChannels[c].users.begin(); !jnext.is_end();)
        {
            OpnChannel::users_iterator j = jnext;
            OpnChannel::LocationData &jd = j->value;
            ++jnext;
            if((jd.loc.MidCh == midCh) && (jd.sustained == OpnChannel::LocationData::Sustain_None))
                jd.sustained |= OpnChannel::LocationData::Sustain_Sostenuto;
        }
    }
}